

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::showHelp(CommandParser *parser)

{
  OptionParser *this;
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  ostream *poVar6;
  pointer pPVar7;
  bool bVar8;
  AllOptions options;
  string exeName;
  HelpOptionParser helpOpt;
  string local_158;
  uint local_134;
  string local_130;
  Command local_110;
  AllOptions local_d8;
  string local_c0;
  long *local_a0;
  long local_98;
  long local_90 [2];
  string local_80;
  OptionParser local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,*parser->m_argv,(allocator<char> *)&local_110);
  lVar3 = std::__cxx11::string::find_last_of((char *)&local_a0,0x1af35d,0xffffffffffffffff);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_a0);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.m_name._M_dataplus._M_p != &local_110.m_name.field_2) {
      operator_delete(local_110.m_name._M_dataplus._M_p,
                      local_110.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  AllOptions::AllOptions(&local_d8);
  Options::HelpOptionParser::HelpOptionParser((HelpOptionParser *)&local_60);
  if (local_d8.m_parsers.
      super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_d8.m_parsers.
      super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00130359:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_a0,local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," is a CATCH host application. Options are as follows:\n\n",0x37);
    showUsage((ostream *)&std::cout);
  }
  else {
    uVar5 = 0;
    do {
      local_134 = (uint)uVar5;
      pPVar7 = local_d8.m_parsers.
               super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        this = pPVar7->m_p;
        OptionParser::find(&local_110,this,parser);
        if ((local_110.m_name._M_string_length == 0) &&
           (local_110.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_110.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          bVar8 = false;
        }
        else {
          OptionParser::optionNames_abi_cxx11_(&local_158,this);
          OptionParser::optionNames_abi_cxx11_(&local_130,&local_60);
          _Var1._M_p = local_130._M_dataplus._M_p;
          if (local_158._M_string_length == local_130._M_string_length) {
            if (local_158._M_string_length == 0) {
              bVar8 = false;
            }
            else {
              iVar2 = bcmp(local_158._M_dataplus._M_p,local_130._M_dataplus._M_p,
                           local_158._M_string_length);
              bVar8 = iVar2 != 0;
            }
          }
          else {
            bVar8 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var1._M_p != &local_130.field_2) {
            operator_delete(_Var1._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_110.m_args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.m_name._M_dataplus._M_p != &local_110.m_name.field_2) {
          operator_delete(local_110.m_name._M_dataplus._M_p,
                          local_110.m_name.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) break;
        pPVar7 = pPVar7 + 1;
        if (pPVar7 == local_d8.m_parsers.
                      super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          if ((local_134 & 1) != 0) goto LAB_00130395;
          goto LAB_00130359;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      OptionParser::optionNames_abi_cxx11_(&local_110.m_name,this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_110.m_name._M_dataplus._M_p,
                          local_110.m_name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
        [5])(&local_158,this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
      (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
        [6])(&local_130,this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
      (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
        [7])(&local_80,this);
      addLineBreaks(&local_c0,&local_80,0x50,2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      paVar4 = &local_110.m_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.m_name._M_dataplus._M_p != paVar4) {
        operator_delete(local_110.m_name._M_dataplus._M_p,
                        local_110.m_name.field_2._M_allocated_capacity + 1);
        paVar4 = extraout_RAX;
      }
      local_d8.m_parsers.
      super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pPVar7 + 1;
      uVar5 = CONCAT71((int7)((ulong)paVar4 >> 8),1);
    } while (local_d8.m_parsers.
             super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_d8.m_parsers.
             super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_00130395:
  local_60.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (NonCopyable)&PTR__OptionParser_001d6008;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.m_optionNames);
  std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>::
  ~vector(&local_d8.m_parsers);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return;
}

Assistant:

inline void showHelp( const CommandParser& parser ) {
        std::string exeName = parser.exeName();
        std::string::size_type pos = exeName.find_last_of( "/\\" );
        if( pos != std::string::npos ) {
            exeName = exeName.substr( pos+1 );
        }

        AllOptions options;
        Options::HelpOptionParser helpOpt;
        bool displayedSpecificOption = false;
        for( AllOptions::const_iterator it = options.begin(); it != options.end(); ++it ) {
            OptionParser& opt = **it;
            if( opt.find( parser ) && opt.optionNames() != helpOpt.optionNames() ) {
                displayedSpecificOption = true;
                std::cout   << "\n" << opt.optionNames() << " " << opt.argsSynopsis() << "\n\n"
                            << opt.optionSummary() << "\n\n"

                << addLineBreaks( opt.optionDescription(), 80, 2 ) << "\n" << std::endl;
            }
        }

        if( !displayedSpecificOption ) {
            std::cout << exeName << " is a CATCH host application. Options are as follows:\n\n";
            showUsage( std::cout );
        }
    }